

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O0

void anon_unknown.dwarf_94447::Json::check_error(string *src,error_code err)

{
  json_out_callbacks *this;
  bool bVar1;
  char *pcVar2;
  parser<json_out_callbacks> *this_00;
  error_code *val1;
  error_code eVar3;
  AssertHelper local_1a8;
  Message local_1a0;
  error_code local_198;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  string res;
  undefined1 local_110 [8];
  parser<json_out_callbacks> p;
  AssertHelper local_50 [3];
  Message local_38;
  error_code local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  error_code err_local;
  string *src_local;
  
  local_2c = none;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = err;
  testing::internal::CmpHelperNE<pstore::json::error_code,pstore::json::error_code>
            ((internal *)local_28,"err","json::error_code::none",
             (error_code *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4),&local_2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    testing::Message::~Message(&local_38);
  }
  p.coordinate_.row = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (p.coordinate_.row == 0) {
    res.field_2._8_8_ = 0;
    this = (json_out_callbacks *)((long)&res.field_2 + 8);
    json_out_callbacks::json_out_callbacks(this);
    pstore::json::parser<json_out_callbacks>::parser
              ((parser<json_out_callbacks> *)local_110,this,none);
    json_out_callbacks::~json_out_callbacks((json_out_callbacks *)((long)&res.field_2 + 8));
    this_00 = pstore::json::parser<json_out_callbacks>::input
                        ((parser<json_out_callbacks> *)local_110,src);
    pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
              ((result_type *)&gtest_ar_1.message_,this_00);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
              ((EqHelper *)local_168,"res","\"\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_1.message_,(char (*) [1])0x1f640a);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
                 ,0x23,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_170);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_170);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
    val1 = pstore::json::parser<json_out_callbacks>::last_error
                     ((parser<json_out_callbacks> *)local_110);
    eVar3 = pstore::json::make_error_code(none);
    local_198._M_cat = eVar3._M_cat;
    local_198._M_value = eVar3._M_value;
    testing::internal::CmpHelperNE<std::error_code,std::error_code>
              ((internal *)local_188,"p.last_error ()","make_error_code (json::error_code::none)",
               val1,&local_198);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_json.cpp"
                 ,0x24,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    pstore::json::parser<json_out_callbacks>::~parser((parser<json_out_callbacks> *)local_110);
  }
  return;
}

Assistant:

static void check_error (std::string const & src, json::error_code err) {
            ASSERT_NE (err, json::error_code::none);
            json::parser<json_out_callbacks> p;
            std::string const res = p.input (src).eof ();
            EXPECT_EQ (res, "");
            EXPECT_NE (p.last_error (), make_error_code (json::error_code::none));
        }